

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

string * jbcoin::Logs::scrub(string *__return_storage_ptr__,string *s)

{
  long lVar1;
  size_t i;
  ulong uVar2;
  ulong uVar3;
  
  lVar1 = std::__cxx11::string::find((char *)s,0x29007e);
  if (lVar1 != -1) {
    uVar2 = lVar1 + 8;
    uVar3 = s->_M_string_length - 1;
    if (lVar1 + 0x2bU <= uVar3) {
      uVar3 = lVar1 + 0x2bU;
    }
    for (; uVar2 < uVar3; uVar2 = uVar2 + 1) {
      (s->_M_dataplus)._M_p[uVar2] = '*';
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  return __return_storage_ptr__;
}

Assistant:

std::string
Logs::scrub (std::string s)
{
    using namespace std;
    char const* secretToken = "\"secret\"";
    // Look for the first occurrence of "secret" in the string.
    size_t startingPosition = s.find (secretToken);
    if (startingPosition != string::npos)
    {
        // Found it, advance past the token.
        startingPosition += strlen (secretToken);
        // Replace the next 35 characters at most, without overwriting the end.
        size_t endingPosition = std::min (startingPosition + 35, s.size () - 1);
        for (size_t i = startingPosition; i < endingPosition; ++i)
            s [i] = '*';
    }
    return s;
}